

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t read_bits_32(archive_read *a,rar5 *rar,uint8_t *p,uint32_t *value)

{
  uint32_t bits;
  uint32_t *value_local;
  uint8_t *p_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  if ((long)(rar->bits).in_addr < (rar->cstate).cur_block_size) {
    *value = (int)(uint)p[(rar->bits).in_addr + L'\x04'] >> (8U - (rar->bits).bit_addr & 0x1f) |
             ((uint)p[(rar->bits).in_addr + L'\x03'] |
             (uint)p[(rar->bits).in_addr + L'\x02'] << 8 |
             (uint)p[(rar->bits).in_addr + L'\x01'] << 0x10 | (uint)p[(rar->bits).in_addr] << 0x18)
             << ((rar->bits).bit_addr & 0x1fU);
    a_local._4_4_ = L'\0';
  }
  else {
    archive_set_error(&a->archive,0x16,"Premature end of stream during extraction of data (#1)");
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int read_bits_32(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, uint32_t* value)
{
	if(rar->bits.in_addr >= rar->cstate.cur_block_size) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_PROGRAMMER,
			"Premature end of stream during extraction of data (#1)");
		return ARCHIVE_FATAL;
	}

	uint32_t bits = ((uint32_t) p[rar->bits.in_addr]) << 24;
	bits |= p[rar->bits.in_addr + 1] << 16;
	bits |= p[rar->bits.in_addr + 2] << 8;
	bits |= p[rar->bits.in_addr + 3];
	bits <<= rar->bits.bit_addr;
	bits |= p[rar->bits.in_addr + 4] >> (8 - rar->bits.bit_addr);
	*value = bits;
	return ARCHIVE_OK;
}